

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O3

LispPTR UFS_deletefile(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  DLword *pDVar8;
  LispPTR LVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  stat sbuf;
  char fbuf [4096];
  char file [4096];
  stat sStack_20b8;
  char local_2028 [4096];
  char local_1028 [4096];
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  iVar5 = 100;
  if (iVar4 == 0) {
    uVar2 = args[1];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    Lisp_errno = (int *)(Lisp_world + uVar2);
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
LAB_001368ac:
      iVar5 = 200;
      if (0xfff < iVar4) goto LAB_0013681d;
    }
    else {
      if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
        iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
        goto LAB_001368ac;
      }
      error("LispStringLength: Not a character array.\n");
    }
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    iVar5 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
    iVar4 = 0x1000;
    if (iVar5 < 0x1000) {
      iVar4 = iVar5;
    }
    lVar6 = (long)iVar4;
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      if (iVar5 == 0) {
        pcVar10 = local_2028;
      }
      else {
        lVar6 = lVar6 + (ulong)(lVar6 == 0);
        pDVar8 = Lisp_world +
                 (ulong)Lisp_world[(ulong)uVar2 + 2] +
                 (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
        pcVar10 = local_2028;
        do {
          *pcVar10 = *(char *)((ulong)pDVar8 ^ 2);
          pcVar10 = pcVar10 + 1;
          pDVar8 = pDVar8 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      *pcVar10 = '\0';
    }
    else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      if (iVar5 != 0) {
        uVar3 = *(uint *)(Lisp_world + uVar2);
        uVar1 = Lisp_world[(ulong)uVar2 + 2];
        lVar11 = 0;
        do {
          local_2028[lVar11] =
               *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^
                        3);
          lVar11 = lVar11 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
      }
      local_2028[lVar6] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    iVar5 = unixpathname(local_2028,local_1028,0,0);
    if (iVar5 == 0) {
      return 0;
    }
    alarm(TIMEOUT_TIME);
    piVar7 = __errno_location();
    do {
      *piVar7 = 0;
      iVar5 = stat(local_1028,&sStack_20b8);
      if (iVar5 != -1) {
        alarm(0);
        alarm(TIMEOUT_TIME);
        if ((sStack_20b8.st_mode & 0xf000) == 0x4000) {
          goto LAB_00136a58;
        }
        goto LAB_00136a7f;
      }
    } while (*piVar7 == 4);
    alarm(0);
    goto LAB_00136ab3;
  }
  goto LAB_0013681d;
  while (*piVar7 == 4) {
LAB_00136a7f:
    *piVar7 = 0;
    iVar5 = unlink(local_1028);
    bVar12 = iVar5 == -1;
    if (!bVar12) break;
  }
  goto LAB_00136a9c;
  while (*piVar7 == 4) {
LAB_00136a58:
    *piVar7 = 0;
    iVar5 = rmdir(local_1028);
    bVar12 = iVar5 == -1;
    if (!bVar12) break;
  }
LAB_00136a9c:
  alarm(0);
  LVar9 = 0x4c;
  if (bVar12) {
LAB_00136ab3:
    iVar5 = *piVar7;
LAB_0013681d:
    *Lisp_errno = iVar5;
    LVar9 = 0;
  }
  return LVar9;
}

Assistant:

LispPTR UFS_deletefile(LispPTR *args)
{
  char file[MAXPATHLEN], fbuf[MAXPATHLEN];
  struct stat sbuf;
  int len, rval;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[1]));

  LispStringLength(args[0], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);

#ifdef DOS
  if (unixpathname(fbuf, file, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, file, 0, 0) == 0) return (NIL);
#endif /* DOS */
  /* check if we're operating on directory or file */
  TIMEOUT(rval = stat(file, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  /*
   * On UNIX device, all we have to do is just to unlink the file
   * or directory
   */
  if (S_ISDIR(sbuf.st_mode)) {
    TIMEOUT(rval = rmdir(file));
  } else {
    TIMEOUT(rval = unlink(file));
  }
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  return (ATOM_T);
}